

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

uint64_t hash_file_contents(io_buf *io,int f)

{
  long lVar1;
  undefined4 in_ESI;
  long *in_RDI;
  ssize_t i;
  ssize_t n;
  uchar buf [1024];
  uint64_t v;
  long local_428;
  byte local_418 [1024];
  uint64_t local_18;
  undefined4 local_c;
  long *local_8;
  
  local_18 = 0x4967a1cbaca3d988;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (lVar1 = (**(code **)(*local_8 + 0x28))(local_8,local_c,local_418,0x400), 0 < lVar1) {
    for (local_428 = 0; local_428 < lVar1; local_428 = local_428 + 1) {
      local_18 = local_18 * 0x145f4971;
      local_18 = local_418[local_428] + local_18;
    }
  }
  return local_18;
}

Assistant:

uint64_t hash_file_contents(io_buf* io, int f)
{
  uint64_t v = 5289374183516789128;
  unsigned char buf[1024];
  while (true)
  {
    ssize_t n = io->read_file(f, buf, 1024);
    if (n <= 0)
      break;
    for (ssize_t i = 0; i < n; i++)
    {
      v *= 341789041;
      v += buf[i];
    }
  }
  return v;
}